

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trim_capabilities_pass.cpp
# Opt level: O2

void __thiscall
spvtools::opt::TrimCapabilitiesPass::TrimCapabilitiesPass(TrimCapabilitiesPass *this)

{
  undefined1 local_b;
  undefined1 local_a;
  undefined1 local_9;
  
  Pass::Pass(&this->super_Pass);
  (this->super_Pass)._vptr_Pass = (_func_int **)&PTR__TrimCapabilitiesPass_003ae990;
  EnumSet<spv::Capability>::EnumSet<spv::Capability_const*>
            (&this->supportedCapabilities_,kSupportedCapabilities._M_elems,
             kForbiddenCapabilities._M_elems);
  EnumSet<spv::Capability>::EnumSet<spv::Capability_const*>
            (&this->forbiddenCapabilities_,kForbiddenCapabilities._M_elems,
             kUntouchableCapabilities._M_elems);
  EnumSet<spv::Capability>::EnumSet<spv::Capability_const*>
            (&this->untouchableCapabilities_,kUntouchableCapabilities._M_elems,
             (Capability *)
             "supportedCapabilities_.contains(capability) && \"Module is using a capability that is not listed as supported.\""
            );
  std::
  _Hashtable<spv::Op,std::pair<spv::Op_const,std::optional<spv::Capability>(*)(spvtools::opt::Instruction_const*)>,std::allocator<std::pair<spv::Op_const,std::optional<spv::Capability>(*)(spvtools::opt::Instruction_const*)>>,std::__detail::_Select1st,std::equal_to<spv::Op>,spvtools::opt::ClassEnumHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
  ::
  _Hashtable<std::pair<spv::Op,std::optional<spv::Capability>(*)(spvtools::opt::Instruction_const*)>const*>
            ((_Hashtable<spv::Op,std::pair<spv::Op_const,std::optional<spv::Capability>(*)(spvtools::opt::Instruction_const*)>,std::allocator<std::pair<spv::Op_const,std::optional<spv::Capability>(*)(spvtools::opt::Instruction_const*)>>,std::__detail::_Select1st,std::equal_to<spv::Op>,spvtools::opt::ClassEnumHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
              *)&this->opcodeHandlers_,kOpcodeHandlers,&typeinfo,0,&local_9,&local_a,&local_b);
  return;
}

Assistant:

TrimCapabilitiesPass::TrimCapabilitiesPass()
    : supportedCapabilities_(
          TrimCapabilitiesPass::kSupportedCapabilities.cbegin(),
          TrimCapabilitiesPass::kSupportedCapabilities.cend()),
      forbiddenCapabilities_(
          TrimCapabilitiesPass::kForbiddenCapabilities.cbegin(),
          TrimCapabilitiesPass::kForbiddenCapabilities.cend()),
      untouchableCapabilities_(
          TrimCapabilitiesPass::kUntouchableCapabilities.cbegin(),
          TrimCapabilitiesPass::kUntouchableCapabilities.cend()),
      opcodeHandlers_(kOpcodeHandlers.cbegin(), kOpcodeHandlers.cend()) {}